

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

bool __thiscall QCommandLineParser::isSet(QCommandLineParser *this,QString *name)

{
  long lVar1;
  QString *pQVar2;
  bool bVar3;
  bool bVar4;
  CaseSensitivity in_R8D;
  long lVar5;
  long in_FS_OFFSET;
  QStringView str;
  QStringView str_00;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  str.m_size = 1;
  str.m_data = (storage_type_conflict *)(name->d).size;
  bVar3 = QtPrivate::QStringList_contains
                    ((QtPrivate *)&this->d->optionNames,(QStringList *)(name->d).ptr,str,in_R8D);
  bVar4 = true;
  if (!bVar3) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QCommandLineParserPrivate::aliases((QStringList *)&local_48,this->d,name);
    lVar1 = (this->d->optionNames).d.size;
    if (lVar1 == 0) {
      bVar4 = false;
    }
    else {
      pQVar2 = (this->d->optionNames).d.ptr;
      lVar5 = 0;
      do {
        str_00.m_size = 1;
        str_00.m_data = *(storage_type_conflict **)((long)&(pQVar2->d).size + lVar5);
        bVar4 = QtPrivate::QStringList_contains
                          ((QtPrivate *)&local_48,*(QStringList **)((long)&(pQVar2->d).ptr + lVar5),
                           str_00,in_R8D);
        if (bVar4) break;
        bVar3 = lVar1 * 0x18 + -0x18 != lVar5;
        lVar5 = lVar5 + 0x18;
      } while (bVar3);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QCommandLineParser::isSet(const QString &name) const
{
    d->checkParsed("isSet");
    if (d->optionNames.contains(name))
        return true;
    const QStringList aliases = d->aliases(name);
    for (const QString &optionName : std::as_const(d->optionNames)) {
        if (aliases.contains(optionName))
            return true;
    }
    return false;
}